

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void lyp_ext_instance_rm(ly_ctx *ctx,lys_ext_instance ***ext,uint8_t *size,uint8_t index)

{
  lys_ext_instance **pplVar1;
  ulong uVar2;
  int iVar3;
  undefined7 in_register_00000009;
  
  iVar3 = (int)CONCAT71(in_register_00000009,index);
  uVar2 = (ulong)(uint)(iVar3 << 3);
  lys_extension_instances_free
            (ctx,*(lys_ext_instance ***)(*(long *)((long)*ext + uVar2) + 0x20),
             (uint)*(byte *)(*(long *)((long)*ext + uVar2) + 0x1a));
  lydict_remove(ctx,*(char **)(*(long *)((long)*ext + uVar2) + 0x10));
  free(*(void **)((long)*ext + uVar2));
  uVar2 = (ulong)(iVar3 + 1U & 0xff);
  while( true ) {
    pplVar1 = *ext;
    if (*size <= (byte)uVar2) break;
    pplVar1[uVar2 - 1] = pplVar1[uVar2];
    uVar2 = uVar2 + 1;
  }
  pplVar1[(ulong)*size - 1] = (lys_ext_instance *)0x0;
  *size = *size + 0xff;
  if (*size != '\0') {
    return;
  }
  free(*ext);
  return;
}

Assistant:

void
lyp_ext_instance_rm(struct ly_ctx *ctx, struct lys_ext_instance ***ext, uint8_t *size, uint8_t index)
{
    uint8_t i;

    lys_extension_instances_free(ctx, (*ext)[index]->ext, (*ext)[index]->ext_size);
    lydict_remove(ctx, (*ext)[index]->arg_value);
    free((*ext)[index]);

    /* move the rest of the array */
    for (i = index + 1; i < (*size); i++) {
        (*ext)[i - 1] = (*ext)[i];
    }
    /* clean the last cell in the array structure */
    (*ext)[(*size) - 1] = NULL;
    /* the array is not reallocated here, just change its size */
    (*size) = (*size) - 1;

    if (!(*size)) {
        /* ext array is empty */
        free((*ext));
        ext = NULL;
    }
}